

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O2

void __thiscall QThreadPipe::~QThreadPipe(QThreadPipe *this)

{
  if (-1 < this->fds[0]) {
    close(this->fds[0]);
  }
  return;
}

Assistant:

QThreadPipe::~QThreadPipe()
{
    if (fds[0] >= 0)
        close(fds[0]);

    if (!UsingEventfd && fds[1] >= 0)
        close(fds[1]);

#if defined(Q_OS_VXWORKS)
    pipeDevDelete(name, true);
#endif
}